

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifstrstream.cpp
# Opt level: O1

void __thiscall OpenMD::ifstrstream::ifstrstream(ifstrstream *this)

{
  std::ios_base::ios_base((ios_base *)&this->field_0x170);
  *(undefined8 *)&this->field_0x248 = 0;
  *(undefined2 *)&this->field_0x250 = 0;
  *(undefined8 *)&this->field_0x258 = 0;
  *(undefined8 *)&this->field_0x260 = 0;
  *(undefined8 *)&this->field_0x268 = 0;
  *(undefined8 *)&this->field_0x270 = 0;
  (this->super_basic_istream<char,_std::char_traits<char>_>)._vptr_basic_istream =
       (_func_int **)0x307b60;
  *(undefined8 *)&this->field_0x170 = 0x307b88;
  (this->super_basic_istream<char,_std::char_traits<char>_>)._M_gcount = 0;
  std::ios::init((streambuf *)&this->field_0x170);
  (this->super_basic_istream<char,_std::char_traits<char>_>)._vptr_basic_istream =
       (_func_int **)&PTR__ifstrstream_00307af0;
  *(undefined ***)&this->field_0x170 = &PTR__ifstrstream_00307b18;
  *(code **)&(this->super_basic_istream<char,_std::char_traits<char>_>).field_0x10 =
       std::istream::_M_extract<double>;
  *(undefined8 *)&(this->super_basic_istream<char,_std::char_traits<char>_>).field_0x18 = 0;
  *(undefined8 *)&(this->super_basic_istream<char,_std::char_traits<char>_>).field_0x20 = 0;
  *(undefined8 *)&(this->super_basic_istream<char,_std::char_traits<char>_>).field_0x28 = 0;
  *(undefined8 *)&(this->super_basic_istream<char,_std::char_traits<char>_>).field_0x30 = 0;
  *(undefined8 *)&(this->super_basic_istream<char,_std::char_traits<char>_>).field_0x38 = 0;
  *(undefined8 *)&(this->super_basic_istream<char,_std::char_traits<char>_>).field_0x40 = 0;
  std::locale::locale((locale *)
                      &(this->super_basic_istream<char,_std::char_traits<char>_>).field_0x48);
  *(code **)&(this->super_basic_istream<char,_std::char_traits<char>_>).field_0x10 =
       std::locale::locale;
  *(undefined4 *)&(this->super_basic_istream<char,_std::char_traits<char>_>).field_0x50 = 0x18;
  *(undefined1 **)&(this->super_basic_istream<char,_std::char_traits<char>_>).field_0x58 =
       &(this->super_basic_istream<char,_std::char_traits<char>_>).field_0x68;
  *(undefined8 *)&(this->super_basic_istream<char,_std::char_traits<char>_>).field_0x60 = 0;
  (this->super_basic_istream<char,_std::char_traits<char>_>).field_0x68 = 0;
  std::filebuf::filebuf
            ((filebuf *)&(this->super_basic_istream<char,_std::char_traits<char>_>).field_0x78);
  this->isRead = false;
  std::ios::init((streambuf *)
                 ((long)&(this->super_basic_istream<char,_std::char_traits<char>_>).
                         _vptr_basic_istream +
                 (long)(this->super_basic_istream<char,_std::char_traits<char>_>).
                       _vptr_basic_istream[-3]));
  return;
}

Assistant:

ifstrstream::ifstrstream() :
      std::basic_istream<char, std::char_traits<char>>(0), internalFileBuf_(),
      isRead(false) {
    this->init(&internalFileBuf_);
  }